

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O2

void Map_SuperTableResize(Map_HashTable_t *p)

{
  uint uVar1;
  ulong uVar2;
  Map_HashEntry_t *pMVar3;
  uint uVar4;
  Map_HashEntry_t **ppMVar5;
  ulong uVar6;
  int iVar7;
  Map_HashEntry_t *pMVar8;
  Map_HashEntry_t *pMVar9;
  ulong uVar10;
  
  uVar1 = p->nBins;
  uVar4 = Abc_PrimeCudd(uVar1 * 2);
  ppMVar5 = (Map_HashEntry_t **)calloc(1,(long)(int)uVar4 << 3);
  uVar6 = 0;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = uVar6;
  }
  iVar7 = 0;
  for (; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    pMVar8 = p->pBins[uVar6];
    if (pMVar8 != (Map_HashEntry_t *)0x0) goto LAB_002fef54;
    pMVar3 = (Map_HashEntry_t *)0x0;
    pMVar9 = pMVar8;
    while (pMVar8 = pMVar3, pMVar9 != (Map_HashEntry_t *)0x0) {
      uVar2 = (ulong)(pMVar9->uTruth[1] * 0x7d3 + pMVar9->uTruth[0]) % (ulong)uVar4;
      pMVar9->pNext = ppMVar5[uVar2];
      ppMVar5[uVar2] = pMVar9;
      iVar7 = iVar7 + 1;
      pMVar3 = (Map_HashEntry_t *)0x0;
      pMVar9 = pMVar8;
      if (pMVar8 != (Map_HashEntry_t *)0x0) {
LAB_002fef54:
        pMVar3 = pMVar8->pNext;
        pMVar9 = pMVar8;
      }
    }
  }
  if (iVar7 != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTable.c"
                  ,0xff,"void Map_SuperTableResize(Map_HashTable_t *)");
  }
  free(p->pBins);
  p->pBins = ppMVar5;
  p->nBins = uVar4;
  return;
}

Assistant:

void Map_SuperTableResize( Map_HashTable_t * p )
{
    Map_HashEntry_t ** pBinsNew;
    Map_HashEntry_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    unsigned Key;
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Map_HashEntry_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Map_HashEntry_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i], pEnt2 = pEnt? pEnt->pNext: NULL; pEnt; 
              pEnt = pEnt2, pEnt2 = pEnt? pEnt->pNext: NULL )
        {
            Key = MAP_TABLE_HASH( pEnt->uTruth[0], pEnt->uTruth[1], nBinsNew );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}